

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

int SSL_early_callback_ctx_extension_get
              (SSL_CLIENT_HELLO *client_hello,uint16_t extension_type,uint8_t **out_data,
              size_t *out_len)

{
  bool bVar1;
  uint8_t *puVar2;
  size_t sVar3;
  undefined1 local_40 [8];
  CBS cbs;
  size_t *out_len_local;
  uint8_t **out_data_local;
  uint16_t extension_type_local;
  SSL_CLIENT_HELLO *client_hello_local;
  
  cbs.len = (size_t)out_len;
  bVar1 = bssl::ssl_client_hello_get_extension(client_hello,(CBS *)local_40,extension_type);
  if (bVar1) {
    puVar2 = CBS_data((CBS *)local_40);
    *out_data = puVar2;
    sVar3 = CBS_len((CBS *)local_40);
    *(size_t *)cbs.len = sVar3;
  }
  client_hello_local._4_4_ = (uint)bVar1;
  return client_hello_local._4_4_;
}

Assistant:

int SSL_early_callback_ctx_extension_get(const SSL_CLIENT_HELLO *client_hello,
                                         uint16_t extension_type,
                                         const uint8_t **out_data,
                                         size_t *out_len) {
  CBS cbs;
  if (!ssl_client_hello_get_extension(client_hello, &cbs, extension_type)) {
    return 0;
  }

  *out_data = CBS_data(&cbs);
  *out_len = CBS_len(&cbs);
  return 1;
}